

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O0

void __thiscall
iDynTree::GravityCompensationHelper::GravityCompensationHelper(GravityCompensationHelper *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  iDynTree::Model::Model((Model *)(in_RDI + 8));
  iDynTree::Traversal::Traversal((Traversal *)(in_RDI + 0x138));
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::vector
            ((vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *)0x5ccfae);
  iDynTree::JointPosDoubleArray::JointPosDoubleArray((JointPosDoubleArray *)(in_RDI + 0x1b0),0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray((JointDOFsDoubleArray *)(in_RDI + 0x1d0),0);
  iDynTree::LinkVelArray::LinkVelArray((LinkVelArray *)(in_RDI + 0x1f0),0);
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 0x208),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x220),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x238),0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            ((FreeFloatingGeneralizedTorques *)(in_RDI + 0x250));
  return;
}

Assistant:

GravityCompensationHelper::GravityCompensationHelper() : m_isModelValid(false),
                                                           m_isKinematicsUpdated(false),
                                                           m_model(),
                                                           m_dynamicTraversal(),
                                                           m_kinematicTraversals(),
                                                           m_jointPos(),
                                                           m_linkVels(),
                                                           m_linkProperAccs(),
                                                           m_linkNetExternalWrenchesZero(),
                                                           m_linkIntWrenches(),
                                                           m_generalizedTorques()
  {

  }